

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

void __thiscall
backend::codegen::Codegen::emit_phi_move
          (Codegen *this,
          unordered_set<mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
          *i)

{
  bool bVar1;
  Reg dest_reg;
  Reg src_reg;
  VarId collapsed;
  VarId id;
  iterator __end2;
  iterator __begin2;
  unordered_set<mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  *__range2;
  VarId *in_stack_ffffffffffffff08;
  RegisterOperand *in_stack_ffffffffffffff10;
  unique_ptr<arm::Arith2Inst,_std::default_delete<arm::Arith2Inst>_> *__u;
  unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *this_00;
  VarId *in_stack_ffffffffffffff40;
  Codegen *in_stack_ffffffffffffff48;
  unique_ptr<arm::Arith2Inst,_std::default_delete<arm::Arith2Inst>_> local_b0 [2];
  undefined4 local_9c;
  _Head_base<0UL,_arm::Inst_*,_false> in_stack_ffffffffffffff68;
  uint *in_stack_ffffffffffffff70;
  Displayable in_stack_ffffffffffffff78;
  VarId local_70;
  Reg local_5c;
  VarId local_48;
  VarId local_38;
  _Node_iterator_base<mir::inst::VarId,_true> local_28;
  _Node_iterator_base<mir::inst::VarId,_true> local_20 [4];
  
  local_20[0]._M_cur =
       (__node_type *)
       std::
       unordered_set<mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
       ::begin((unordered_set<mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                *)in_stack_ffffffffffffff08);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_set<mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
       ::end((unordered_set<mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
              *)in_stack_ffffffffffffff08);
  while (bVar1 = std::__detail::operator!=(local_20,&local_28), bVar1) {
    std::__detail::_Node_iterator<mir::inst::VarId,_true,_true>::operator*
              ((_Node_iterator<mir::inst::VarId,_true,_true> *)0x20fb19);
    mir::inst::VarId::VarId((VarId *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    mir::inst::VarId::VarId((VarId *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    get_collapsed_var(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    bVar1 = mir::inst::VarId::operator==(&local_48,&local_38);
    if (!bVar1) {
      in_stack_ffffffffffffff08 = &local_70;
      mir::inst::VarId::VarId((VarId *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      local_5c = get_or_alloc_vgp((Codegen *)collapsed._8_8_,
                                  (VarId *)collapsed.super_Displayable._vptr_Displayable);
      in_stack_ffffffffffffff10 = (RegisterOperand *)&stack0xffffffffffffff78;
      mir::inst::VarId::VarId((VarId *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      get_or_alloc_vgp((Codegen *)collapsed._8_8_,
                       (VarId *)collapsed.super_Displayable._vptr_Displayable);
      local_9c = 6;
      __u = local_b0;
      arm::RegisterOperand::RegisterOperand
                (in_stack_ffffffffffffff10,(Reg)((ulong)in_stack_ffffffffffffff08 >> 0x20));
      this_00 = (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&stack0xffffffffffffff68;
      std::make_unique<arm::Arith2Inst,arm::OpCode,unsigned_int&,arm::RegisterOperand>
                ((OpCode *)in_stack_ffffffffffffff78._vptr_Displayable,in_stack_ffffffffffffff70,
                 (RegisterOperand *)in_stack_ffffffffffffff68._M_head_impl);
      std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>::
      unique_ptr<arm::Arith2Inst,std::default_delete<arm::Arith2Inst>,void>(this_00,__u);
      std::
      vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
      ::push_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                   *)in_stack_ffffffffffffff10,(value_type *)in_stack_ffffffffffffff08);
      std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::~unique_ptr(this_00);
      std::unique_ptr<arm::Arith2Inst,_std::default_delete<arm::Arith2Inst>_>::~unique_ptr
                ((unique_ptr<arm::Arith2Inst,_std::default_delete<arm::Arith2Inst>_> *)
                 in_stack_ffffffffffffff10);
    }
    std::__detail::_Node_iterator<mir::inst::VarId,_true,_true>::operator++
              ((_Node_iterator<mir::inst::VarId,_true,_true> *)in_stack_ffffffffffffff10);
  }
  return;
}

Assistant:

void Codegen::emit_phi_move(std::unordered_set<mir::inst::VarId>& i) {
  for (auto id : i) {
    auto collapsed = get_collapsed_var(id);
    if (collapsed == id) {
      continue;
    }
    auto src_reg = get_or_alloc_vgp(id);
    // display_reg_name(LOG(DEBUG), src_reg);
    // auto vis = std::set<mir::inst::VarId>();
    // for (auto it = collapsed.first; it != collapsed.second; it++) {
    //   if (vis.find(it->second) != vis.end()) continue;
    //   vis.insert(it->second);
    auto dest_reg = get_or_alloc_vgp(collapsed);
    inst.push_back(std::make_unique<Arith2Inst>(OpCode::Mov, dest_reg,
                                                RegisterOperand(src_reg)));
    // }
  }
}